

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect dockedGeometry(QWidget *widget)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  QRect QVar4;
  bool bVar5;
  QDockWidgetLayout *this;
  QRect *pQVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetLayout *layout;
  int titleHeight;
  QRect result;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QDockWidgetLayout *in_stack_fffffffffffffff0;
  undefined8 uVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::layout((QWidget *)0x571b59);
  this = qobject_cast<QDockWidgetLayout*>((QObject *)0x571b61);
  if ((this != (QDockWidgetLayout *)0x0) &&
     (bVar5 = QDockWidgetLayout::nativeWindowDeco(this), bVar5)) {
    QDockWidgetLayout::titleHeight(in_stack_fffffffffffffff0);
  }
  pQVar6 = QWidget::geometry(in_RDI);
  uVar2 = pQVar6->x1;
  uVar3 = pQVar6->y1;
  QVar4.y1.m_i = uVar3;
  QVar4.x1.m_i = uVar2;
  uVar7._0_4_ = pQVar6->x2;
  uVar7._4_4_ = pQVar6->y2;
  QRect::adjust((QRect *)this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar4.x2.m_i = (int)uVar7;
  QVar4.y2.m_i = (int)((ulong)uVar7 >> 0x20);
  return QVar4;
}

Assistant:

static QRect dockedGeometry(QWidget *widget)
{
    int titleHeight = 0;

    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(widget->layout());
    if (layout && layout->nativeWindowDeco())
        titleHeight = layout->titleHeight();

    QRect result = widget->geometry();
    result.adjust(0, -titleHeight, 0, 0);
    return result;
}